

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.cpp
# Opt level: O3

TypeInfos * anon_unknown.dwarf_2ca0ff8::TypeInfos::get(void)

{
  undefined1 extraout_AL;
  undefined7 in_register_00000001;
  undefined7 extraout_var;
  
  if ((anonymous_namespace)::TypeInfos::get()::instance != '\0') {
    return (TypeInfos *)
           CONCAT71(in_register_00000001,(anonymous_namespace)::TypeInfos::get()::instance);
  }
  _GLOBAL__N_1::TypeInfos::get();
  return (TypeInfos *)CONCAT71(extraout_var,extraout_AL);
}

Assistant:

TypeInfos* TypeInfos::get() {
  static aligned_storage<sizeof(TypeInfos), alignof(TypeInfos)>::type memory;

  struct Instance {
    TypeInfos* ptr() { return reinterpret_cast<TypeInfos*>(memory.data); }
    Instance() { new (ptr()) TypeInfos(); }
    ~Instance() { ptr()->release(); }
  };

  static Instance instance;
  return instance.ptr();
}